

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

knetFile * knet_open(char *fn,char *mode)

{
  int iVar1;
  knetFile *ftp;
  char *mode_00;
  
  if (*mode != 'r') {
    fwrite("[kftp_open] only mode \"r\" is supported.\n",0x28,1,_stderr);
    return (knetFile *)0x0;
  }
  iVar1 = strncmp(fn,"ftp://",6);
  if (iVar1 == 0) {
    ftp = kftp_parse_url(fn,mode);
    if (ftp == (knetFile *)0x0) {
      return (knetFile *)0x0;
    }
    iVar1 = kftp_connect(ftp);
    if (iVar1 == -1) goto LAB_00110b37;
    kftp_connect_file(ftp);
  }
  else {
    mode_00 = "http://";
    iVar1 = strncmp(fn,"http://",7);
    if (iVar1 == 0) {
      ftp = khttp_parse_url(fn,mode_00);
      if (ftp == (knetFile *)0x0) {
        return (knetFile *)0x0;
      }
      khttp_connect_file(ftp);
    }
    else {
      iVar1 = open(fn,0);
      if (iVar1 == -1) {
        perror("open");
        return (knetFile *)0x0;
      }
      ftp = (knetFile *)calloc(1,0x80);
      ftp->type = 1;
      ftp->fd = iVar1;
      ftp->ctrl_fd = -1;
    }
  }
  if (ftp->fd != -1) {
    return ftp;
  }
LAB_00110b37:
  knet_close(ftp);
  return (knetFile *)0x0;
}

Assistant:

knetFile *knet_open(const char *fn, const char *mode)
{
	knetFile *fp = 0;
	if (mode[0] != 'r') {
		fprintf(stderr, "[kftp_open] only mode \"r\" is supported.\n");
		return 0;
	}
	if (strstr(fn, "ftp://") == fn) {
		fp = kftp_parse_url(fn, mode);
		if (fp == 0) return 0;
		if (kftp_connect(fp) == -1) {
			knet_close(fp);
			return 0;
		}
		kftp_connect_file(fp);
	} else if (strstr(fn, "http://") == fn) {
		fp = khttp_parse_url(fn, mode);
		if (fp == 0) return 0;
		khttp_connect_file(fp);
	} else { // local file
#ifdef _WIN32
		/* In windows, O_BINARY is necessary. In Linux/Mac, O_BINARY may
		 * be undefined on some systems, although it is defined on my
		 * Mac and the Linux I have tested on. */
		int fd = open(fn, O_RDONLY | O_BINARY);
#else		
		int fd = open(fn, O_RDONLY);
#endif
		if (fd == -1) {
			perror("open");
			return 0;
		}
		fp = (knetFile*)calloc(1, sizeof(knetFile));
		fp->type = KNF_TYPE_LOCAL;
		fp->fd = fd;
		fp->ctrl_fd = -1;
	}
	if (fp && fp->fd == -1) {
		knet_close(fp);
		return 0;
	}
	return fp;
}